

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Serializer.cpp
# Opt level: O2

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
adios2::format::BP3Serializer::AggregateCollectiveMetadataIndices
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          BP3Serializer *this,Comm *comm,BufferSTL *bufferSTL)

{
  size_t *position;
  vector<char,_std::allocator<char>_> *out;
  undefined1 *deserializedIndices;
  size_type __n;
  void *pvVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  size_t sVar8;
  size_t sVar9;
  _func_int *p_Var10;
  int *piVar11;
  undefined8 uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BPBase::SerialElementIndex,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BPBase::SerialElementIndex>_>_>
  *indices;
  lock_guard<std::mutex> lock;
  undefined1 *puVar16;
  size_t sVar17;
  int size;
  ScopedTimer __var2365;
  anon_class_8_1_8991fb9c lf_SerializeIndices;
  ScopedTimer __var2357;
  ScopedTimer local_130 [4];
  size_t local_110;
  vector<char,_std::allocator<char>_> *local_108;
  size_t local_100;
  size_t local_f8;
  ScopedTimer __var2565;
  anon_class_24_3_e2114302 lf_SortMergeIndices;
  anon_class_16_2_3fe5c9bc lf_DeserializeIndices;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_a8 [5];
  
  if (AggregateCollectiveMetadataIndices(adios2::helper::Comm_const&,adios2::format::BufferSTL&)::
      __var357 == '\0') {
    iVar6 = __cxa_guard_acquire(&AggregateCollectiveMetadataIndices(adios2::helper::Comm_const&,adios2::format::BufferSTL&)
                                 ::__var357);
    if (iVar6 != 0) {
      uVar12 = ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/format/bp/bp3/BP3Serializer.cpp"
                                   ,
                                   "std::vector<size_t> adios2::format::BP3Serializer::AggregateCollectiveMetadataIndices(const helper::Comm &, BufferSTL &)"
                                   ,0x165);
      AggregateCollectiveMetadataIndices::__var357 = (void *)ps_timer_create_(uVar12);
      __cxa_guard_release(&AggregateCollectiveMetadataIndices(adios2::helper::Comm_const&,adios2::format::BufferSTL&)
                           ::__var357);
    }
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer
            (&__var2357,AggregateCollectiveMetadataIndices::__var357);
  iVar6 = helper::Comm::Rank(comm);
  size = helper::Comm::Size(comm);
  if (iVar6 == 0) {
    if (AggregateCollectiveMetadataIndices(adios2::helper::Comm_const&,adios2::format::BufferSTL&)::
        __var365 == '\0') {
      iVar7 = __cxa_guard_acquire(&AggregateCollectiveMetadataIndices(adios2::helper::Comm_const&,adios2::format::BufferSTL&)
                                   ::__var365);
      if (iVar7 != 0) {
        uVar12 = ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/format/bp/bp3/BP3Serializer.cpp"
                                     ,
                                     "std::vector<size_t> adios2::format::BP3Serializer::AggregateCollectiveMetadataIndices(const helper::Comm &, BufferSTL &)"
                                     ,0x16d);
        AggregateCollectiveMetadataIndices::__var365 = (void *)ps_timer_create_(uVar12);
        __cxa_guard_release(&AggregateCollectiveMetadataIndices(adios2::helper::Comm_const&,adios2::format::BufferSTL&)
                             ::__var365);
      }
    }
    external::perfstubs_profiler::ScopedTimer::ScopedTimer
              (&__var2365,AggregateCollectiveMetadataIndices::__var365);
    puVar16 = &(this->super_BP3Base).field_0x50;
    p_Var10 = (this->super_BP3Base)._vptr_BP3Base[-3];
    std::vector<char,_std::allocator<char>_>::reserve
              ((vector<char,_std::allocator<char>_> *)puVar16,
               (long)size *
               (*(long *)(&(this->super_BP3Base).field_0xf0 + (long)p_Var10) -
               *(long *)(&(this->super_BP3Base).field_0xe8 + (long)p_Var10)));
    std::vector<char,_std::allocator<char>_>::resize
              ((vector<char,_std::allocator<char>_> *)puVar16,0);
    puVar16 = &(this->super_BP3Base).field_0x68;
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::clear((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             *)puVar16);
    std::__detail::
    _Rehash_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_std::integral_constant<bool,_true>_>
    ::reserve((_Rehash_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_std::integral_constant<bool,_true>_>
               *)puVar16,
              *(size_t *)
               (&(this->super_BP3Base).field_0x140 + (long)(this->super_BP3Base)._vptr_BP3Base[-3]))
    ;
    puVar16 = &(this->super_BP3Base).field_0xa0;
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::clear((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             *)puVar16);
    std::__detail::
    _Rehash_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_std::integral_constant<bool,_true>_>
    ::reserve((_Rehash_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_std::integral_constant<bool,_true>_>
               *)puVar16,
              *(size_t *)
               (&(this->super_BP3Base).field_0x178 + (long)(this->super_BP3Base)._vptr_BP3Base[-3]))
    ;
    external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&__var2365);
  }
  lf_DeserializeIndices.size = &size;
  lf_SerializeIndices.this = this;
  lf_SortMergeIndices.bufferSTL = bufferSTL;
  lf_SortMergeIndices.this = this;
  lf_SortMergeIndices.comm = comm;
  lf_DeserializeIndices.this = this;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (__return_storage_ptr__,3,(allocator_type *)&__var2365);
  *(__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
   _M_impl.super__Vector_impl_data._M_start = (bufferSTL->super_Buffer).m_AbsolutePosition;
  if (AggregateCollectiveMetadataIndices(adios2::helper::Comm_const&,adios2::format::BufferSTL&)::
      $_2::operator()(adios2::helper::Comm_const&,int)::__var403 == '\0') {
    iVar7 = __cxa_guard_acquire(&AggregateCollectiveMetadataIndices(adios2::helper::Comm_const&,adios2::format::BufferSTL&)
                                 ::$_2::operator()(adios2::helper::Comm_const&,int)::__var403);
    if (iVar7 != 0) {
      uVar12 = ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/format/bp/bp3/BP3Serializer.cpp"
                                   ,
                                   "auto adios2::format::BP3Serializer::AggregateCollectiveMetadataIndices(const helper::Comm &, BufferSTL &)::(anonymous class)::operator()(const helper::Comm &, const int) const"
                                   ,0x193);
      AggregateCollectiveMetadataIndices(adios2::helper::Comm_const&,adios2::format::BufferSTL&)::
      $_2::operator()(adios2::helper::Comm_const&,int)::__var403 =
           (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BPBase::SerialElementIndex,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BPBase::SerialElementIndex>_>_>
            *)ps_timer_create_(uVar12);
      __cxa_guard_release(&AggregateCollectiveMetadataIndices(adios2::helper::Comm_const&,adios2::format::BufferSTL&)
                           ::$_2::operator()(adios2::helper::Comm_const&,int)::__var403);
    }
  }
  indices = AggregateCollectiveMetadataIndices(adios2::helper::Comm_const&,adios2::format::BufferSTL&)
            ::$_2::operator()(adios2::helper::Comm_const&,int)::__var403;
  external::perfstubs_profiler::ScopedTimer::ScopedTimer
            (&__var2365,
             AggregateCollectiveMetadataIndices(adios2::helper::Comm_const&,adios2::format::BufferSTL&)
             ::$_2::operator()(adios2::helper::Comm_const&,int)::__var403);
  p_Var10 = (this->super_BP3Base)._vptr_BP3Base[-3];
  lVar14 = *(long *)(&(this->super_BP3Base).field_0xf0 + (long)p_Var10) -
           *(long *)(&(this->super_BP3Base).field_0xe8 + (long)p_Var10);
  sVar8 = AggregateCollectiveMetadataIndices::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)(&(this->super_BP3Base).field_0x128 + (long)p_Var10)
                     ,indices);
  sVar9 = AggregateCollectiveMetadataIndices::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)
                     (&(this->super_BP3Base).field_0x160 +
                     (long)(this->super_BP3Base)._vptr_BP3Base[-3]),indices);
  puVar16 = &(this->super_BP3Base).field_0x20;
  __n = sVar9 + 0x24 + sVar8 + lVar14;
  std::vector<char,_std::allocator<char>_>::reserve
            ((vector<char,_std::allocator<char>_> *)puVar16,__n);
  std::vector<char,_std::allocator<char>_>::resize
            ((vector<char,_std::allocator<char>_> *)puVar16,__n);
  **(int **)&(this->super_BP3Base).field_0x20 = iVar6;
  *(size_t *)(*(long *)&(this->super_BP3Base).field_0x20 + 4) = sVar9 + sVar8 + lVar14 + 0x20;
  *(long *)(*(long *)&(this->super_BP3Base).field_0x20 + 0xc) = lVar14 + 0x24;
  *(size_t *)(*(long *)&(this->super_BP3Base).field_0x20 + 0x14) = sVar8 + lVar14 + 0x24;
  *(undefined8 *)(*(long *)&(this->super_BP3Base).field_0x20 + 0x1c) =
       *(undefined8 *)
        (&(this->super_BP3Base).field_0x1a0 + (long)(this->super_BP3Base)._vptr_BP3Base[-3]);
  p_Var10 = (this->super_BP3Base)._vptr_BP3Base[-3];
  pvVar1 = *(void **)(&(this->super_BP3Base).field_0xe8 + (long)p_Var10);
  sVar17 = *(long *)(&(this->super_BP3Base).field_0xf0 + (long)p_Var10) - (long)pvVar1;
  if (sVar17 != 0) {
    memmove((void *)(*(long *)&(this->super_BP3Base).field_0x20 + 0x24),pvVar1,sVar17);
    p_Var10 = (this->super_BP3Base)._vptr_BP3Base[-3];
  }
  local_130[0].m_timer = (void *)(sVar17 + 0x24);
  AggregateCollectiveMetadataIndices::anon_class_8_1_8991fb9c::operator()
            (&lf_SerializeIndices,
             (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BPBase::SerialElementIndex,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BPBase::SerialElementIndex>_>_>
              *)(&(this->super_BP3Base).field_0x128 + (long)p_Var10),(size_t *)local_130);
  AggregateCollectiveMetadataIndices::anon_class_8_1_8991fb9c::operator()
            (&lf_SerializeIndices,
             (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BPBase::SerialElementIndex,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BPBase::SerialElementIndex>_>_>
              *)(&(this->super_BP3Base).field_0x160 + (long)(this->super_BP3Base)._vptr_BP3Base[-3])
             ,(size_t *)local_130);
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&__var2365);
  position = &(bufferSTL->super_Buffer).m_Position;
  local_110 = (bufferSTL->super_Buffer).m_Position;
  out = &bufferSTL->m_Buffer;
  helper::Comm::GathervVectors<char>
            (comm,(vector<char,_std::allocator<char>_> *)puVar16,out,position,0);
  uVar15 = (ulong)(*(int *)(&(this->super_BP3Base).field_0x198 +
                           (long)(this->super_BP3Base)._vptr_BP3Base[-3]) + 0x28);
  std::vector<char,_std::allocator<char>_>::reserve(out,*position + uVar15);
  std::vector<char,_std::allocator<char>_>::resize(out,*position + uVar15);
  if (iVar6 == 0) {
    if (AggregateCollectiveMetadataIndices(adios2::helper::Comm_const&,adios2::format::BufferSTL&)::
        __var565 == '\0') {
      iVar6 = __cxa_guard_acquire(&AggregateCollectiveMetadataIndices(adios2::helper::Comm_const&,adios2::format::BufferSTL&)
                                   ::__var565);
      if (iVar6 != 0) {
        uVar12 = ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/format/bp/bp3/BP3Serializer.cpp"
                                     ,
                                     "std::vector<size_t> adios2::format::BP3Serializer::AggregateCollectiveMetadataIndices(const helper::Comm &, BufferSTL &)"
                                     ,0x235);
        AggregateCollectiveMetadataIndices::__var565 = (void *)ps_timer_create_(uVar12);
        __cxa_guard_release(&AggregateCollectiveMetadataIndices(adios2::helper::Comm_const&,adios2::format::BufferSTL&)
                             ::__var565);
      }
    }
    external::perfstubs_profiler::ScopedTimer::ScopedTimer
              (&__var2565,AggregateCollectiveMetadataIndices::__var565);
    local_100 = *position;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__var2365,4,
               (allocator_type *)local_130);
    helper::IsLittleEndian();
    local_108 = (vector<char,_std::allocator<char>_> *)&(this->super_BP3Base).field_0x50;
    puVar16 = &(this->super_BP3Base).field_0x68;
    deserializedIndices = &(this->super_BP3Base).field_0xa0;
    lVar14 = 0;
    for (uVar15 = 0; uVar15 < local_100; uVar15 = uVar15 + 4 + *__var2365.m_timer) {
      piVar11 = (int *)((out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                        super__Vector_impl_data._M_start + uVar15);
      iVar6 = *piVar11;
      for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
        *(undefined8 *)((long)__var2365.m_timer + lVar13 * 8) =
             *(undefined8 *)(piVar11 + lVar13 * 2 + 1);
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a8,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__var2365);
      if (AggregateCollectiveMetadataIndices(adios2::helper::Comm_const&,adios2::format::BufferSTL&)
          ::$_4::
          operator()(int,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<char,std::allocator<char>>const&,unsigned_long)
          ::__var487 == '\0') {
        iVar7 = __cxa_guard_acquire(&AggregateCollectiveMetadataIndices(adios2::helper::Comm_const&,adios2::format::BufferSTL&)
                                     ::$_4::
                                     operator()(int,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<char,std::allocator<char>>const&,unsigned_long)
                                     ::__var487);
        if (iVar7 != 0) {
          uVar12 = ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/format/bp/bp3/BP3Serializer.cpp"
                                       ,
                                       "auto adios2::format::BP3Serializer::AggregateCollectiveMetadataIndices(const helper::Comm &, BufferSTL &)::(anonymous class)::operator()(const int, const std::vector<size_t>, const std::vector<char> &, const size_t) const"
                                       ,0x1e7);
          AggregateCollectiveMetadataIndices(adios2::helper::Comm_const&,adios2::format::BufferSTL&)
          ::$_4::
          operator()(int,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<char,std::allocator<char>>const&,unsigned_long)
          ::__var487 = (void *)ps_timer_create_(uVar12);
          __cxa_guard_release(&AggregateCollectiveMetadataIndices(adios2::helper::Comm_const&,adios2::format::BufferSTL&)
                               ::$_4::
                               operator()(int,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<char,std::allocator<char>>const&,unsigned_long)
                               ::__var487);
        }
      }
      external::perfstubs_profiler::ScopedTimer::ScopedTimer
                (local_130,
                 AggregateCollectiveMetadataIndices(adios2::helper::Comm_const&,adios2::format::BufferSTL&)
                 ::$_4::
                 operator()(int,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<char,std::allocator<char>>const&,unsigned_long)
                 ::__var487);
      uVar2 = *local_a8[0]._M_impl.super__Vector_impl_data._M_start;
      uVar3 = local_a8[0]._M_impl.super__Vector_impl_data._M_start[1];
      uVar4 = local_a8[0]._M_impl.super__Vector_impl_data._M_start[2];
      lVar14 = lVar14 + local_a8[0]._M_impl.super__Vector_impl_data._M_start[3];
      std::mutex::lock((mutex *)BPSerializer::m_Mutex);
      local_f8 = uVar3 + uVar15;
      helper::InsertToBuffer<char>
                (local_108,
                 (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start + uVar15 + 0x24,uVar3 - 0x24);
      pthread_mutex_unlock((pthread_mutex_t *)BPSerializer::m_Mutex);
      AggregateCollectiveMetadataIndices::anon_class_16_2_3fe5c9bc::operator()
                (&lf_DeserializeIndices,
                 (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>_>_>_>
                  *)puVar16,iVar6,out,local_f8,uVar4 + uVar15,false);
      AggregateCollectiveMetadataIndices::anon_class_16_2_3fe5c9bc::operator()
                (&lf_DeserializeIndices,
                 (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>_>_>_>
                  *)deserializedIndices,iVar6,out,uVar4 + uVar15,uVar2 + uVar15 + 4,true);
      external::perfstubs_profiler::ScopedTimer::~ScopedTimer(local_130);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(local_a8);
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&__var2365);
    external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&__var2565);
    if (AggregateCollectiveMetadataIndices(adios2::helper::Comm_const&,adios2::format::BufferSTL&)::
        __var596 == '\0') {
      iVar6 = __cxa_guard_acquire(&AggregateCollectiveMetadataIndices(adios2::helper::Comm_const&,adios2::format::BufferSTL&)
                                   ::__var596);
      if (iVar6 != 0) {
        uVar12 = ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/format/bp/bp3/BP3Serializer.cpp"
                                     ,
                                     "std::vector<size_t> adios2::format::BP3Serializer::AggregateCollectiveMetadataIndices(const helper::Comm &, BufferSTL &)"
                                     ,0x254);
        AggregateCollectiveMetadataIndices::__var596 = (void *)ps_timer_create_(uVar12);
        __cxa_guard_release(&AggregateCollectiveMetadataIndices(adios2::helper::Comm_const&,adios2::format::BufferSTL&)
                             ::__var596);
      }
    }
    external::perfstubs_profiler::ScopedTimer::ScopedTimer
              (&__var2365,AggregateCollectiveMetadataIndices::__var596);
    *position = local_110;
    lVar13 = *(long *)&(this->super_BP3Base).field_0x58;
    lVar5 = *(long *)&(this->super_BP3Base).field_0x50;
    *(long *)((out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
              ._M_start + local_110) = lVar14;
    sVar8 = *position;
    *position = sVar8 + 8;
    *(long *)((out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
              ._M_start + sVar8 + 8) = lVar13 - lVar5;
    sVar8 = *position + 8;
    *position = sVar8;
    pvVar1 = *(void **)&(this->super_BP3Base).field_0x50;
    sVar17 = *(long *)&(this->super_BP3Base).field_0x58 - (long)pvVar1;
    if (sVar17 != 0) {
      memmove((out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
              ._M_start + sVar8,pvVar1,sVar17);
      sVar8 = *position;
    }
    (bufferSTL->super_Buffer).m_Position = sVar8 + sVar17;
    (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
    _M_impl.super__Vector_impl_data._M_start[1] =
         sVar8 + sVar17 + (bufferSTL->super_Buffer).m_AbsolutePosition;
    AggregateCollectiveMetadataIndices::anon_class_24_3_e2114302::operator()
              (&lf_SortMergeIndices,
               (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>_>_>_>
                *)puVar16);
    (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
    _M_impl.super__Vector_impl_data._M_start[2] =
         (bufferSTL->super_Buffer).m_Position + (bufferSTL->super_Buffer).m_AbsolutePosition;
    AggregateCollectiveMetadataIndices::anon_class_24_3_e2114302::operator()
              (&lf_SortMergeIndices,
               (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>_>_>_>
                *)deserializedIndices);
    external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&__var2365);
  }
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&__var2357);
  return __return_storage_ptr__;
}

Assistant:

std::vector<size_t> BP3Serializer::AggregateCollectiveMetadataIndices(helper::Comm const &comm,
                                                                      BufferSTL &bufferSTL)
{
    PERFSTUBS_SCOPED_TIMER_FUNC();
    int rank = comm.Rank();
    int size = comm.Size();

    // pre-allocate with rank 0 data
    size_t pgCount = 0; //< tracks global PG count
    if (rank == 0)
    {
        PERFSTUBS_SCOPED_TIMER_FUNC();
        // assumes that things are more or less balanced
        m_PGRankIndices.reserve(m_MetadataSet.PGIndex.Buffer.size() * static_cast<size_t>(size));
        m_PGRankIndices.resize(0);

        m_VariableRankIndices.clear();
        m_VariableRankIndices.reserve(m_MetadataSet.VarsIndices.size());

        m_AttributesRankIndices.clear();
        m_AttributesRankIndices.reserve(m_MetadataSet.AttributesIndices.size());
    }

    auto lf_IndicesSize =
        [&](const std::unordered_map<std::string, SerialElementIndex> &indices) -> size_t

    {
        PERFSTUBS_SCOPED_TIMER_FUNC();
        size_t indicesSize = 0;
        for (const auto &indexPair : indices)
        {
            indicesSize += indexPair.second.Buffer.size();
        }
        return indicesSize;
    };

    auto lf_SerializeIndices =
        [&](const std::unordered_map<std::string, SerialElementIndex> &indices, size_t &position)

    {
        PERFSTUBS_SCOPED_TIMER_FUNC();
        for (const auto &indexPair : indices)
        {
            const auto &buffer = indexPair.second.Buffer;
            helper::CopyToBuffer(m_SerializedIndices, position, buffer.data(), buffer.size());
        }
    };

    auto lf_SerializeAllIndices = [&](helper::Comm const &comm, const int rank) {
        PERFSTUBS_SCOPED_TIMER_FUNC();
        const size_t pgIndicesSize = m_MetadataSet.PGIndex.Buffer.size();
        const size_t variablesIndicesSize = lf_IndicesSize(m_MetadataSet.VarsIndices);
        const size_t attributesIndicesSize = lf_IndicesSize(m_MetadataSet.AttributesIndices);

        // first pre-allocate
        const size_t serializedIndicesSize =
            8 * 4 + pgIndicesSize + variablesIndicesSize + attributesIndicesSize;

        m_SerializedIndices.reserve(serializedIndicesSize + 4);
        m_SerializedIndices.resize(serializedIndicesSize + 4);

        const uint32_t rank32 = static_cast<uint32_t>(rank);
        const uint64_t size64 = static_cast<uint64_t>(serializedIndicesSize);
        const uint64_t variablesIndexOffset = static_cast<uint64_t>(pgIndicesSize + 36);
        const uint64_t attributesIndexOffset =
            static_cast<uint64_t>(pgIndicesSize + 36 + variablesIndicesSize);

        size_t position = 0;
        helper::CopyToBuffer(m_SerializedIndices, position, &rank32);
        helper::CopyToBuffer(m_SerializedIndices, position, &size64);
        helper::CopyToBuffer(m_SerializedIndices, position, &variablesIndexOffset);
        helper::CopyToBuffer(m_SerializedIndices, position, &attributesIndexOffset);
        helper::CopyToBuffer(m_SerializedIndices, position, &m_MetadataSet.DataPGCount);

        helper::CopyToBuffer(m_SerializedIndices, position, m_MetadataSet.PGIndex.Buffer.data(),
                             m_MetadataSet.PGIndex.Buffer.size());
        lf_SerializeIndices(m_MetadataSet.VarsIndices, position);
        lf_SerializeIndices(m_MetadataSet.AttributesIndices, position);
    };

    auto lf_DeserializeIndices =
        [&](std::unordered_map<std::string, std::vector<SerialElementIndex>> &deserialized,
            const int rankSource, const std::vector<char> &serialized, const size_t position,
            const size_t endPosition, const bool isRankConstant)

    {
        PERFSTUBS_SCOPED_TIMER_FUNC();
        size_t localPosition = position;
        while (localPosition < endPosition)
        {
            size_t indexPosition = localPosition;
            const ElementIndexHeader header =
                ReadElementIndexHeader(serialized, indexPosition, helper::IsLittleEndian());
            const size_t bufferSize = static_cast<size_t>(header.Length) + 4;

            if (isRankConstant && deserialized.count(header.Name) == 1)
            {
                localPosition += bufferSize;
                continue;
            }
            std::vector<BP3Base::SerialElementIndex> *deserializedIndexes = nullptr;
            auto search = deserialized.find(header.Name);
            if (search == deserialized.end())
            {
                // key (variable name) is not in the map, add it
                // mutex portion
                {
                    std::lock_guard<std::mutex> lock(m_Mutex);
                    deserializedIndexes =
                        &(deserialized
                              .emplace(std::piecewise_construct, std::forward_as_tuple(header.Name),
                                       std::forward_as_tuple(
                                           size, SerialElementIndex(header.MemberID, bufferSize)))
                              .first->second);
                }
            }
            else
            {
                // variable name is already in the map, just get the pointer
                // of the vector of metadata indices
                deserializedIndexes = &(search->second);
            }

            SerialElementIndex &index = deserializedIndexes->at(static_cast<size_t>(rankSource));
            helper::InsertToBuffer(index.Buffer, &serialized[localPosition], bufferSize);
            localPosition += bufferSize;
        }
    };

    auto lf_DeserializeAllIndices = [&](const int rankSource, const std::vector<size_t> headerInfo,
                                        const std::vector<char> &serialized, const size_t position)

    {
        PERFSTUBS_SCOPED_TIMER_FUNC();
        const size_t rankIndicesSize = headerInfo[0];
        const size_t variablesIndexOffset = headerInfo[1] + position;
        const size_t attributesIndexOffset = headerInfo[2] + position;
        pgCount += headerInfo[3];
        size_t localPosition = position + 36;

        const size_t pgIndexLength = variablesIndexOffset - localPosition;
        // first deserialize pg indices
        {
            std::lock_guard<std::mutex> lock(m_Mutex);
            helper::InsertToBuffer(m_PGRankIndices, &serialized[localPosition], pgIndexLength);
        }
        // deserialize variable indices
        localPosition = variablesIndexOffset;
        size_t endPosition = attributesIndexOffset;

        lf_DeserializeIndices(m_VariableRankIndices, rankSource, serialized, localPosition,
                              endPosition, false);

        // deserialize attributes indices
        localPosition = attributesIndexOffset;
        endPosition = rankIndicesSize + 4 + position;
        // attributes are constant and unique across ranks
        lf_DeserializeIndices(m_AttributesRankIndices, rankSource, serialized, localPosition,
                              endPosition, true);
    };

    auto lf_SortMergeIndices =
        [&](const std::unordered_map<std::string, std::vector<SerialElementIndex>>
                &deserializedIndices) {
            PERFSTUBS_SCOPED_TIMER_FUNC();
            auto &position = bufferSTL.m_Position;
            auto &buffer = bufferSTL.m_Buffer;

            size_t countPosition = position;

            const uint32_t totalCountU32 = static_cast<uint32_t>(deserializedIndices.size());
            helper::CopyToBuffer(buffer, countPosition, &totalCountU32);
            position += 12; // skip for length

            MergeSerializeIndices(deserializedIndices, comm, bufferSTL);

            // Write length
            const uint64_t totalLengthU64 = static_cast<uint64_t>(position - countPosition - 8);
            helper::CopyToBuffer(buffer, countPosition, &totalLengthU64);
        };

    // BODY of function starts here
    std::vector<size_t> indexPositions(3);
    // pgIndex
    indexPositions[0] = bufferSTL.m_AbsolutePosition;

    lf_SerializeAllIndices(comm, rank); // Set m_SerializedIndices

    size_t countPosition = bufferSTL.m_Position;

    comm.GathervVectors(m_SerializedIndices, bufferSTL.m_Buffer, bufferSTL.m_Position, 0);

    // use bufferSTL (will resize) to GatherV
    const size_t extraSize = 16 + 12 + 12 + m_MetadataSet.MiniFooterSize;

    try
    {
        bufferSTL.m_Buffer.reserve(bufferSTL.m_Position + extraSize); // to avoid power of 2 growth
        bufferSTL.m_Buffer.resize(bufferSTL.m_Position + extraSize);
    }
    catch (...)
    {
        helper::ThrowNested<std::runtime_error>(
            "Toolkit::Format", "bp::bp3::BP3Serializer", "AggregateCollectiveMetadataIndices",
            "buffer overflow when resizing to " + std::to_string(bufferSTL.m_Position + extraSize) +
                " bytes");
    }

    // deserialize, it's all local inside rank 0
    if (rank == 0)
    {
        PERFSTUBS_SCOPED_TIMER_FUNC();
        const size_t serializedSize = bufferSTL.m_Position;
        const std::vector<char> &serialized = bufferSTL.m_Buffer;
        size_t serializedPosition = 0;
        std::vector<size_t> headerInfo(4);
        const bool isLittleEndian = helper::IsLittleEndian();

        // if (m_Parameters.Threads == 1)
        {
            while (serializedPosition < serializedSize)
            {
                size_t localPosition = serializedPosition;

                const int rankSource = static_cast<int>(
                    helper::ReadValue<uint32_t>(serialized, localPosition, isLittleEndian));

                for (auto i = 0; i < 4; ++i)
                {
                    headerInfo[i] = static_cast<size_t>(
                        helper::ReadValue<uint64_t>(serialized, localPosition, isLittleEndian));
                }

                lf_DeserializeAllIndices(rankSource, headerInfo, serialized, serializedPosition);
                serializedPosition += headerInfo[0] + 4;
            }
        }
    }

    // now merge (and sort variables and attributes) indices
    if (rank == 0)
    {
        PERFSTUBS_SCOPED_TIMER_FUNC();
        auto &position = bufferSTL.m_Position;
        auto &buffer = bufferSTL.m_Buffer;
        position = countPosition; // back to pg count position

        const uint64_t pgCount64 = static_cast<uint64_t>(pgCount);
        const uint64_t pgLength64 = static_cast<uint64_t>(m_PGRankIndices.size());

        helper::CopyToBuffer(buffer, position, &pgCount64);
        helper::CopyToBuffer(buffer, position, &pgLength64);
        helper::CopyToBuffer(buffer, position, m_PGRankIndices.data(), m_PGRankIndices.size());

        indexPositions[1] = bufferSTL.m_AbsolutePosition + position;
        lf_SortMergeIndices(m_VariableRankIndices);
        indexPositions[2] = bufferSTL.m_AbsolutePosition + position;
        lf_SortMergeIndices(m_AttributesRankIndices);
    }

    return indexPositions;
}